

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl.cpp
# Opt level: O0

void __thiscall DBOPL::change_waveform(DBOPL *this,Bitu regbase,op_type *op_pt)

{
  op_type *op_pt_local;
  Bitu regbase_local;
  DBOPL *this_local;
  
  op_pt_local = (op_type *)regbase;
  if (0xff < regbase) {
    op_pt_local = (op_type *)(regbase - 0xea);
  }
  op_pt->cur_wmask = wavemask[this->wave_sel[(long)op_pt_local]];
  op_pt->cur_wform = wavtable + waveform[this->wave_sel[(long)op_pt_local]];
  return;
}

Assistant:

void DBOPL::change_waveform(Bitu regbase, op_type* op_pt) {
#if defined(OPLTYPE_IS_OPL3)
	if (regbase>=ARC_SECONDSET) regbase -= (ARC_SECONDSET-22);	// second set starts at 22
#endif
	// waveform selection
	op_pt->cur_wmask = wavemask[wave_sel[regbase]];
	op_pt->cur_wform = &wavtable[waveform[wave_sel[regbase]]];
	// (might need to be adapted to waveform type here...)
}